

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_operators.cpp
# Opt level: O2

void test_parse_and_compare_reverse<bool(*)(semver::version<int,int,int>const&,semver::version<int,int,int>const&)noexcept>
               (string_view v1,string_view v2,
               _func_bool_version<int,_int,_int>_ptr_version<int,_int,_int>_ptr *op)

{
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  bool bVar1;
  string_view str;
  string_view str_00;
  from_chars_result fVar2;
  SourceLineInfo local_1b8;
  _func_bool_version<int,_int,_int>_ptr_version<int,_int,_int>_ptr *local_1a8;
  AssertionHandler catchAssertionHandler_1;
  SourceLineInfo local_150;
  version<int,_int,_int> parsed_v2;
  version<int,_int,_int> parsed_v1;
  StringRef local_70;
  StringRef local_60;
  StringRef local_50;
  StringRef local_40;
  
  str._M_len = v1._M_str;
  parsed_v1.prerelease_tag_._M_dataplus._M_p = (pointer)&parsed_v1.prerelease_tag_.field_2;
  parsed_v1.major_ = 0;
  parsed_v1.minor_ = 1;
  parsed_v1.patch_ = 0;
  parsed_v1.prerelease_tag_._M_string_length = 0;
  parsed_v1.prerelease_tag_.field_2._M_local_buf[0] = '\0';
  parsed_v1.build_metadata_._M_dataplus._M_p = (pointer)&parsed_v1.build_metadata_.field_2;
  parsed_v1.build_metadata_._M_string_length = 0;
  parsed_v1.build_metadata_.field_2._M_local_buf[0] = '\0';
  parsed_v1.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsed_v1.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  parsed_v1.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  catchAssertionHandler_1.m_assertionInfo.macroName.m_start = "REQUIRE";
  catchAssertionHandler_1.m_assertionInfo.macroName.m_size = 7;
  local_1b8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_operators.cpp";
  local_1b8.line = 8;
  local_1a8 = op;
  Catch::StringRef::StringRef(&local_40,"semver::parse(v1, parsed_v1)");
  capturedExpression_00.m_size = local_40.m_size;
  capturedExpression_00.m_start = local_40.m_start;
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&parsed_v2,(StringRef *)&catchAssertionHandler_1,&local_1b8,
             capturedExpression_00,Normal);
  str._M_str = (char *)&parsed_v1;
  fVar2 = semver::detail::parse<int,int,int>
                    ((detail *)v1._M_len,str,(version<int,_int,_int> *)local_40.m_start);
  catchAssertionHandler_1.m_assertionInfo.macroName.m_start = fVar2.super_from_chars_result.ptr;
  catchAssertionHandler_1.m_assertionInfo.macroName.m_size =
       CONCAT44(catchAssertionHandler_1.m_assertionInfo.macroName.m_size._4_4_,
                fVar2.super_from_chars_result.ec);
  local_1b8.file = (char *)&catchAssertionHandler_1;
  Catch::AssertionHandler::handleExpr<semver::from_chars_result_const&>
            ((AssertionHandler *)&parsed_v2,(ExprLhs<const_semver::from_chars_result_&> *)&local_1b8
            );
  Catch::AssertionHandler::complete((AssertionHandler *)&parsed_v2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&parsed_v2);
  parsed_v2.major_ = 0;
  parsed_v2.minor_ = 1;
  parsed_v2.patch_ = 0;
  parsed_v2.prerelease_tag_._M_dataplus._M_p = (pointer)&parsed_v2.prerelease_tag_.field_2;
  parsed_v2.prerelease_tag_._M_string_length = 0;
  parsed_v2.prerelease_tag_.field_2._M_local_buf[0] = '\0';
  parsed_v2.build_metadata_._M_dataplus._M_p = (pointer)&parsed_v2.build_metadata_.field_2;
  parsed_v2.build_metadata_._M_string_length = 0;
  parsed_v2.build_metadata_.field_2._M_local_buf[0] = '\0';
  parsed_v2.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parsed_v2.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsed_v2.prerelease_identifiers.
  super__Vector_base<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.file = "REQUIRE";
  local_1b8.line = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_operators.cpp";
  local_150.line = 0xb;
  Catch::StringRef::StringRef(&local_50,"semver::parse(v2, parsed_v2)");
  capturedExpression.m_size = local_50.m_size;
  capturedExpression.m_start = local_50.m_start;
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_1,(StringRef *)&local_1b8,&local_150,capturedExpression,Normal);
  str_00._M_str = (char *)&parsed_v2;
  str_00._M_len = (size_t)v2._M_str;
  fVar2 = semver::detail::parse<int,int,int>
                    ((detail *)v2._M_len,str_00,(version<int,_int,_int> *)local_50.m_start);
  local_1b8.file = fVar2.super_from_chars_result.ptr;
  local_1b8.line = CONCAT44(local_1b8.line._4_4_,fVar2.super_from_chars_result.ec);
  local_150.file = (char *)&local_1b8;
  Catch::AssertionHandler::handleExpr<semver::from_chars_result_const&>
            (&catchAssertionHandler_1,(ExprLhs<const_semver::from_chars_result_&> *)&local_150);
  Catch::AssertionHandler::complete(&catchAssertionHandler_1);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_1);
  local_1b8.file = "REQUIRE";
  local_1b8.line = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_operators.cpp";
  local_150.line = 0xd;
  Catch::StringRef::StringRef(&local_60,"op(parsed_v1, parsed_v2)");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_1,(StringRef *)&local_1b8,&local_150,local_60,Normal);
  bVar1 = (*local_1a8)(&parsed_v1,&parsed_v2);
  local_1b8.file = (char *)CONCAT71(local_1b8.file._1_7_,bVar1);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler_1,(ExprLhs<bool> *)&local_1b8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_1);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_1);
  local_1b8.file = "REQUIRE";
  local_1b8.line = 7;
  local_150.file =
       "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]semver/test/test_operators.cpp";
  local_150.line = 0xe;
  Catch::StringRef::StringRef(&local_70,"op(parsed_v2, parsed_v1)");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_1,(StringRef *)&local_1b8,&local_150,local_70,Normal);
  bVar1 = (*local_1a8)(&parsed_v2,&parsed_v1);
  local_1b8.file = (char *)CONCAT71(local_1b8.file._1_7_,bVar1);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler_1,(ExprLhs<bool> *)&local_1b8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_1);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_1);
  semver::version<int,_int,_int>::~version(&parsed_v2);
  semver::version<int,_int,_int>::~version(&parsed_v1);
  return;
}

Assistant:

static void test_parse_and_compare_reverse(const std::string_view v1, const std::string_view v2, Operator op) {
  semver::version parsed_v1;
  REQUIRE(semver::parse(v1, parsed_v1));

  semver::version parsed_v2;
  REQUIRE(semver::parse(v2, parsed_v2));

  REQUIRE(op(parsed_v1, parsed_v2));
  REQUIRE(op(parsed_v2, parsed_v1));
}